

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_value(basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
             *this,json_visitor *visitor,uint8_t type,error_code *ec)

{
  bool bVar1;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *source;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *b;
  type_conflict2 tVar2;
  reference pvVar3;
  basic_json_visitor<char> *this_00;
  string_view_type *value;
  char *__str;
  long lVar4;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *this_01;
  error_code *in_RCX;
  char in_DL;
  ser_context *in_RSI;
  long in_RDI;
  type tVar5;
  decimal128_to_chars_result dVar6;
  decimal128_t *in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  oid_t oid;
  size_t n_8;
  uint8_t buf_7 [12];
  decimal128_to_chars_result r;
  decimal128_t dec;
  size_t n_7;
  uint8_t buf_6 [16];
  uint8_t subtype;
  type_conflict len;
  size_t n_6;
  uint8_t buf_5 [4];
  type_conflict6 val_3;
  size_t n_5;
  uint8_t buf_4 [8];
  type_conflict6 val_2;
  size_t n_4;
  uint8_t buf_3 [8];
  type_conflict2 val_1;
  size_t n_3;
  uint8_t buf_2 [8];
  type_conflict val;
  size_t n_2;
  uint8_t buf_1 [4];
  size_t n_1;
  uint8_t c;
  type result_1;
  type result;
  double res;
  size_t n;
  uint8_t buf [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
  *in_stack_fffffffffffffdb0;
  semantic_tag sVar7;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *this_02;
  string_view_type *in_stack_fffffffffffffdb8;
  bson_errc bVar8;
  error_code *in_stack_fffffffffffffdc0;
  string_type *in_stack_fffffffffffffdc8;
  type_conflict tVar10;
  char *pcVar9;
  basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_fffffffffffffdd0;
  json_visitor *in_stack_fffffffffffffdd8;
  basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_fffffffffffffde0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffde8;
  error_code *in_stack_fffffffffffffdf0;
  string_type *in_stack_fffffffffffffdf8;
  basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_fffffffffffffe00;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  char *local_150;
  errc local_148;
  TP1 local_140;
  type_conflict2 local_130;
  uint8_t local_128 [8];
  uint8_t auStack_120 [20];
  type_conflict local_10c;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *local_108;
  uint8_t local_fc [4];
  type_conflict6 local_f8;
  type_conflict2 local_f0;
  uint8_t local_e8 [8];
  type_conflict6 local_e0;
  type_conflict2 local_d8;
  uint8_t local_d0 [8];
  type_conflict2 local_c8;
  type_conflict2 local_c0;
  uint8_t local_b4 [8];
  type_conflict local_ac;
  type_conflict2 local_a8;
  uint8_t local_9c [4];
  type_conflict2 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  char *local_68;
  conv_errc local_60;
  undefined1 local_58 [16];
  char *local_48;
  conv_errc local_40;
  type_conflict1 local_38;
  type_conflict2 local_30;
  uint8_t local_28 [8];
  error_code *local_20;
  ser_context *local_10;
  
  if (in_DL == '\x01') {
    tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                       in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                       (size_t)in_stack_fffffffffffffdc0);
    local_30 = tVar2;
    pvVar3 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ::back(in_stack_fffffffffffffdb0);
    sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
    pvVar3->pos = tVar2 + pvVar3->pos;
    if (local_30 == 8) {
      local_38 = binary::little_to_native<double,jsoncons::detail::endian>(local_28,8);
      basic_json_visitor<char>::double_value
                ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,
                 (double)in_stack_fffffffffffffdb8,sVar7,(ser_context *)in_stack_fffffffffffffda8,
                 (error_code *)0x285891);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      return;
    }
    std::error_code::operator=
              (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    *(undefined1 *)(in_RDI + 8) = 0;
    return;
  }
  local_20 = in_RCX;
  if (in_DL != '\x02') {
    if (in_DL == '\x03') {
      begin_document(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (error_code *)in_stack_fffffffffffffdd0);
      return;
    }
    if (in_DL == '\x04') {
      begin_array(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                  (error_code *)in_stack_fffffffffffffdd0);
      return;
    }
    if (in_DL == '\x05') {
      tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
              read<std::input_iterator_tag>
                        ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                         in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                         (size_t)in_stack_fffffffffffffdc0);
      bVar8 = (bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
      local_108 = (binary_iterator_source<(anonymous_namespace)::MyIterator> *)tVar2;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_fffffffffffffdb0);
      pvVar3->pos = tVar2 + pvVar3->pos;
      if (local_108 != (binary_iterator_source<(anonymous_namespace)::MyIterator> *)0x4) {
        std::error_code::operator=(in_stack_fffffffffffffdc0,bVar8);
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_10c = binary::little_to_native<int,jsoncons::detail::endian>(local_fc,4);
      if (local_10c < 0) {
        std::error_code::operator=(in_stack_fffffffffffffdc0,bVar8);
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      source = (binary_iterator_source<(anonymous_namespace)::MyIterator> *)
               binary_iterator_source<(anonymous_namespace)::MyIterator>::
               read<std::input_iterator_tag>
                         ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                          in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                          (size_t)in_stack_fffffffffffffdc0);
      tVar10 = (type_conflict)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
      local_108 = source;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_fffffffffffffdb0);
      pvVar3->pos = (long)&(source->current_).p_ + pvVar3->pos;
      if (local_108 != (binary_iterator_source<(anonymous_namespace)::MyIterator> *)0x1) {
        std::error_code::operator=(in_stack_fffffffffffffdc0,bVar8);
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x28631e);
      b = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
          source_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>>::
          read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (source,in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
      local_108 = (binary_iterator_source<(anonymous_namespace)::MyIterator> *)b;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_fffffffffffffdb0);
      pvVar3->pos = (long)&(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start + pvVar3->pos;
      if (local_108 == (binary_iterator_source<(anonymous_namespace)::MyIterator> *)(long)local_10c)
      {
        basic_json_visitor<char>::
        byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((basic_json_visitor<char> *)source,b,(uint64_t)in_stack_fffffffffffffde0,
                   (ser_context *)in_stack_fffffffffffffdd8,(error_code *)in_stack_fffffffffffffdd0,
                   tVar10);
        *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
        return;
      }
      std::error_code::operator=(in_stack_fffffffffffffdc0,bVar8);
      *(undefined1 *)(in_RDI + 8) = 0;
      return;
    }
    sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb8 >> 0x38);
    if (in_DL == '\x06') {
      basic_json_visitor<char>::null_value
                ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,sVar7,
                 (ser_context *)in_stack_fffffffffffffdb0,(error_code *)in_stack_fffffffffffffda8);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      return;
    }
    if (in_DL == '\a') {
      local_10 = in_RSI;
      this_01 = (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *
                )binary_iterator_source<(anonymous_namespace)::MyIterator>::
                 read<std::input_iterator_tag>
                           ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                            in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                            (size_t)in_stack_fffffffffffffdc0);
      this_02 = this_01;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(this_01);
      pvVar3->pos = (long)&(this_02->
                           super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                           )._M_impl.super__Vector_impl_data._M_start + pvVar3->pos;
      if (this_01 ==
          (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)0xc)
      {
        oid_t::oid_t((oid_t *)this_02,(uint8_t *)in_stack_fffffffffffffda8);
        to_string<std::__cxx11::string>((oid_t *)this_02,in_stack_fffffffffffffda8);
        sVar7 = (semantic_tag)((ulong)this_02 >> 0x38);
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x98));
        basic_json_visitor<char>::string_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   sVar7,local_10,(error_code *)0x28672c);
        *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
        return;
      }
      std::error_code::operator=
                (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      return;
    }
    if (in_DL == '\b') {
      tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
              read<std::input_iterator_tag>
                        ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                         in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                         (size_t)in_stack_fffffffffffffdc0);
      bVar8 = (bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
      local_98 = tVar2;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_fffffffffffffdb0);
      pvVar3->pos = tVar2 + pvVar3->pos;
      if (local_98 == 1) {
        basic_json_visitor<char>::bool_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,SUB41(bVar8 >> 0x18,0),
                   (semantic_tag)(bVar8 >> 0x10),(ser_context *)in_stack_fffffffffffffdb0,
                   (error_code *)in_stack_fffffffffffffda8);
        *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
        return;
      }
      std::error_code::operator=(in_stack_fffffffffffffdc0,bVar8);
      *(undefined1 *)(in_RDI + 8) = 0;
      return;
    }
    if (in_DL == '\t') {
      tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
              read<std::input_iterator_tag>
                        ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                         in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                         (size_t)in_stack_fffffffffffffdc0);
      local_f0 = tVar2;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_fffffffffffffdb0);
      sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
      pvVar3->pos = tVar2 + pvVar3->pos;
      if (local_f0 == 8) {
        local_f8 = binary::little_to_native<long,jsoncons::detail::endian>(local_e8,8);
        basic_json_visitor<char>::int64_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,
                   (int64_t)in_stack_fffffffffffffdb8,sVar7,(ser_context *)in_stack_fffffffffffffda8
                   ,(error_code *)0x286189);
        *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
        return;
      }
      std::error_code::operator=
                (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      return;
    }
    if (in_DL == '\n') {
      basic_json_visitor<char>::null_value
                ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,sVar7,
                 (ser_context *)in_stack_fffffffffffffdb0,(error_code *)in_stack_fffffffffffffda8);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      return;
    }
    if (in_DL == '\v') {
      std::__cxx11::string::clear();
      sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
      std::__cxx11::string::push_back((char)in_RDI + -0x68);
      read_cstring(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        return;
      }
      std::__cxx11::string::push_back((char)in_RDI + -0x68);
      read_cstring(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        return;
      }
      local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x98))
      ;
      basic_json_visitor<char>::string_value
                ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 sVar7,(ser_context *)in_stack_fffffffffffffda8,(error_code *)0x285c5b);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      return;
    }
    if (in_DL == '\r') {
      std::__cxx11::string::clear();
      sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
      read_string(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        return;
      }
      std::__cxx11::string::data();
      std::__cxx11::string::size();
      tVar5 = unicode_traits::validate<char>
                        ((char *)in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
      local_68 = tVar5.ptr;
      local_60 = tVar5.ec;
      if (local_60 == success) {
        local_78 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(in_RDI + 0x98));
        basic_json_visitor<char>::string_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   sVar7,(ser_context *)in_stack_fffffffffffffda8,(error_code *)0x285b28);
        *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
        return;
      }
      std::error_code::operator=
                (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      return;
    }
    if (in_DL != '\x0e') {
      if (in_DL == '\x10') {
        tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                           in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                           (size_t)in_stack_fffffffffffffdc0);
        local_a8 = tVar2;
        pvVar3 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(in_stack_fffffffffffffdb0);
        sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
        pvVar3->pos = tVar2 + pvVar3->pos;
        if (local_a8 == 4) {
          local_ac = binary::little_to_native<int,jsoncons::detail::endian>(local_9c,4);
          basic_json_visitor<char>::int64_value
                    ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,
                     (int64_t)in_stack_fffffffffffffdb8,sVar7,
                     (ser_context *)in_stack_fffffffffffffda8,(error_code *)0x285ed1);
          *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
          return;
        }
        std::error_code::operator=
                  (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      if (in_DL == '\x11') {
        tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                           in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                           (size_t)in_stack_fffffffffffffdc0);
        local_c0 = tVar2;
        pvVar3 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(in_stack_fffffffffffffdb0);
        sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
        pvVar3->pos = tVar2 + pvVar3->pos;
        if (local_c0 == 8) {
          local_c8 = binary::little_to_native<unsigned_long,jsoncons::detail::endian>(local_b4,8);
          basic_json_visitor<char>::uint64_value
                    ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,
                     (uint64_t)in_stack_fffffffffffffdb8,sVar7,
                     (ser_context *)in_stack_fffffffffffffda8,(error_code *)0x285fb8);
          *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
          return;
        }
        std::error_code::operator=
                  (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      if (in_DL == '\x12') {
        tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                           in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                           (size_t)in_stack_fffffffffffffdc0);
        local_d8 = tVar2;
        pvVar3 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(in_stack_fffffffffffffdb0);
        sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
        pvVar3->pos = tVar2 + pvVar3->pos;
        if (local_d8 == 8) {
          local_e0 = binary::little_to_native<long,jsoncons::detail::endian>(local_d0,8);
          basic_json_visitor<char>::int64_value
                    ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,
                     (int64_t)in_stack_fffffffffffffdb8,sVar7,
                     (ser_context *)in_stack_fffffffffffffda8,(error_code *)0x28609f);
          *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
          return;
        }
        std::error_code::operator=
                  (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      if (in_DL == '\x13') {
        tVar2 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                           in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8,
                           (size_t)in_stack_fffffffffffffdc0);
        bVar8 = (bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
        local_130 = tVar2;
        pvVar3 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(in_stack_fffffffffffffdb0);
        sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
        pvVar3->pos = tVar2 + pvVar3->pos;
        if (local_130 == 0x10) {
          TP1::TP1(&local_140);
          local_140.low =
               binary::little_to_native<unsigned_long,jsoncons::detail::endian>(local_128,8);
          local_140.high =
               binary::little_to_native<unsigned_long,jsoncons::detail::endian>(auStack_120,8);
          std::__cxx11::string::clear();
          std::__cxx11::string::resize(in_RDI + 0x98);
          this_00 = (basic_json_visitor<char> *)std::__cxx11::string::operator[](in_RDI + 0x98);
          value = (string_view_type *)std::__cxx11::string::operator[](in_RDI + 0x98);
          std::__cxx11::string::size();
          dVar6 = decimal128_to_chars(in_stack_00000020,in_stack_00000018,in_stack_00000010);
          local_150 = dVar6.ptr;
          local_148 = dVar6.ec;
          __str = (char *)std::__cxx11::string::data();
          pcVar9 = local_150;
          lVar4 = std::__cxx11::string::data();
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_160,__str,(long)pcVar9 - lVar4);
          basic_json_visitor<char>::string_value
                    (this_00,value,sVar7,(ser_context *)in_stack_fffffffffffffda8,
                     (error_code *)0x2865ff);
          *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
          return;
        }
        std::error_code::operator=(in_stack_fffffffffffffdc0,bVar8);
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      if ((in_DL != '\x7f') && (in_DL != -1)) {
        std::error_code::operator=
                  (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
    }
  }
  std::__cxx11::string::clear();
  sVar7 = (semantic_tag)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
  read_string(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar1) {
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    tVar5 = unicode_traits::validate<char>
                      ((char *)in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
    local_48 = tVar5.ptr;
    local_40 = tVar5.ec;
    if (local_40 == success) {
      local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x98))
      ;
      basic_json_visitor<char>::string_value
                ((basic_json_visitor<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 sVar7,(ser_context *)in_stack_fffffffffffffda8,(error_code *)0x2859db);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
    }
    else {
      std::error_code::operator=
                (in_stack_fffffffffffffdc0,(bson_errc)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
    }
  }
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }